

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O2

FT_Long cff_parse_num(CFF_Parser parser,FT_Byte **d)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  byte *start;
  FT_Fixed FVar4;
  
  start = *d;
  if (*start == 0xff) {
    return (long)(((ulong)((uint)start[3] | (uint)start[2] << 8 | (uint)start[1] << 0x10) << 0x28) +
                 0x800000000000) >> 0x30;
  }
  if (*start == 0x1e) {
    FVar4 = cff_parse_real(parser,start,0,(FT_Long *)0x0);
    return FVar4 >> 0x10;
  }
  bVar2 = *start;
  if (bVar2 == 0x1d) {
    if (start + 4 < parser->limit) {
      uVar3 = *(uint *)(start + 1);
      return (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                    );
    }
  }
  else {
    pbVar1 = start + 1;
    if (bVar2 == 0x1c) {
      if (start + 2 < parser->limit) {
        return (long)(short)((ushort)*pbVar1 << 8) | (ulong)start[2];
      }
    }
    else {
      if (bVar2 < 0xf7) {
        return (ulong)bVar2 - 0x8b;
      }
      if (bVar2 < 0xfb) {
        if (pbVar1 < parser->limit) {
          return (ulong)(((uint)bVar2 * 0x100 + (uint)*pbVar1) - 0xf694);
        }
      }
      else if (pbVar1 < parser->limit) {
        return 0xfa94 - (ulong)CONCAT11(bVar2,*pbVar1);
      }
    }
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Long )
  cff_parse_num( CFF_Parser  parser,
                 FT_Byte**   d )
  {
    if ( **d == 30 )
    {
      /* binary-coded decimal is truncated to integer */
      return cff_parse_real( parser, *d, 0, NULL ) >> 16;
    }

    else if ( **d == 255 )
    {
      /* 16.16 fixed-point is used internally for CFF2 blend results. */
      /* Since these are trusted values, a limit check is not needed. */

      /* After the 255, 4 bytes give the number.                 */
      /* The blend value is converted to integer, with rounding; */
      /* due to the right-shift we don't need the lowest byte.   */
#if 0
      return (FT_Short)(
               ( ( ( (FT_UInt32)*( d[0] + 1 ) << 24 ) |
                   ( (FT_UInt32)*( d[0] + 2 ) << 16 ) |
                   ( (FT_UInt32)*( d[0] + 3 ) <<  8 ) |
                     (FT_UInt32)*( d[0] + 4 )         ) + 0x8000U ) >> 16 );
#else
      return (FT_Short)(
               ( ( ( (FT_UInt32)*( d[0] + 1 ) << 16 ) |
                   ( (FT_UInt32)*( d[0] + 2 ) <<  8 ) |
                     (FT_UInt32)*( d[0] + 3 )         ) + 0x80U ) >> 8 );
#endif
    }

    else
      return cff_parse_integer( parser, *d );
  }